

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls-network.c
# Opt level: O0

int lws_tls_check_all_cert_lifetimes(lws_context *context)

{
  int iVar1;
  lws_vhost *local_20;
  lws_vhost *v;
  lws_context *context_local;
  
  local_20 = context->vhost_list;
  while( true ) {
    if (local_20 == (lws_vhost *)0x0) {
      return 0;
    }
    iVar1 = lws_tls_check_cert_lifetime(local_20);
    if (iVar1 < 0) break;
    local_20 = local_20->vhost_next;
  }
  return -1;
}

Assistant:

int
lws_tls_check_all_cert_lifetimes(struct lws_context *context)
{
	struct lws_vhost *v = context->vhost_list;

	while (v) {
		if (lws_tls_check_cert_lifetime(v) < 0)
			return -1;
		v = v->vhost_next;
	}

	return 0;
}